

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_elements_address.cpp
# Opt level: O0

void __thiscall
ElementsAddressFactory_GetAddressByHash160_Test::TestBody
          (ElementsAddressFactory_GetAddressByHash160_Test *this)

{
  undefined1 uVar1;
  bool bVar2;
  undefined1 uVar3;
  AddressType AVar4;
  char *lhs;
  CfdException *anon_var_0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Address address;
  ElementsAddressFactory factory;
  undefined6 in_stack_fffffffffffffb68;
  undefined1 in_stack_fffffffffffffb6e;
  undefined1 in_stack_fffffffffffffb6f;
  Address *in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb78;
  undefined4 uVar5;
  NetType in_stack_fffffffffffffb7c;
  ElementsAddressFactory *in_stack_fffffffffffffb80;
  undefined7 in_stack_fffffffffffffb88;
  AssertHelper local_460;
  Message local_458 [3];
  ByteData160 local_440 [17];
  byte local_2a1;
  ConstCharPtr local_2a0;
  AssertHelper local_298;
  Message local_290;
  undefined4 local_288;
  AddressType local_284;
  AssertionResult local_280;
  AssertHelper local_270;
  Message local_268;
  ByteData local_260;
  string local_248;
  AssertionResult local_228;
  allocator local_211;
  string local_210;
  ByteData160 local_1f0;
  Address local_1d8;
  
  cfd::core::GetElementsAddressFormatList();
  cfd::ElementsAddressFactory::ElementsAddressFactory
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb7c,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             in_stack_fffffffffffffb70);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             in_stack_fffffffffffffb80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_210,"c4d571179a455b8976b79cf99183fd2bbafe6bfd",&local_211);
  cfd::core::ByteData160::ByteData160(&local_1f0,&local_210);
  cfd::AddressFactory::GetAddressByHash
            ((AddressFactory *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
             (AddressType)((ulong)in_stack_fffffffffffffb70 >> 0x20),
             (ByteData160 *)
             CONCAT17(in_stack_fffffffffffffb6f,
                      CONCAT16(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb68)));
  cfd::core::ByteData160::~ByteData160((ByteData160 *)0x1f945c);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  cfd::core::Address::GetHash
            ((Address *)
             CONCAT17(in_stack_fffffffffffffb6f,
                      CONCAT16(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb68)));
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_248,&local_260);
  lhs = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_228,"address.GetHash().GetHex().c_str()",
             "\"c4d571179a455b8976b79cf99183fd2bbafe6bfd\"",lhs,
             "c4d571179a455b8976b79cf99183fd2bbafe6bfd");
  std::__cxx11::string::~string((string *)&local_248);
  cfd::core::ByteData::~ByteData((ByteData *)0x1f94f2);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(&local_228);
  if (!(bool)uVar1) {
    testing::Message::Message(&local_268);
    in_stack_fffffffffffffb80 =
         (ElementsAddressFactory *)
         testing::AssertionResult::failure_message((AssertionResult *)0x1f9640);
    testing::internal::AssertHelper::AssertHelper
              (&local_270,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x9a,(char *)in_stack_fffffffffffffb80);
    testing::internal::AssertHelper::operator=(&local_270,&local_268);
    testing::internal::AssertHelper::~AssertHelper(&local_270);
    testing::Message::~Message((Message *)0x1f969d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1f96f5);
  AVar4 = cfd::core::Address::GetAddressType(&local_1d8);
  local_288 = 2;
  local_284 = AVar4;
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            ((char *)CONCAT17(uVar1,in_stack_fffffffffffffb88),(char *)in_stack_fffffffffffffb80,
             (AddressType *)CONCAT44(AVar4,in_stack_fffffffffffffb78),
             (AddressType *)in_stack_fffffffffffffb70);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_280);
  uVar5 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffb78);
  if (!bVar2) {
    testing::Message::Message(&local_290);
    in_stack_fffffffffffffb70 =
         (Address *)testing::AssertionResult::failure_message((AssertionResult *)0x1f97b4);
    testing::internal::AssertHelper::AssertHelper
              (&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x9b,(char *)in_stack_fffffffffffffb70);
    testing::internal::AssertHelper::operator=(&local_298,&local_290);
    testing::internal::AssertHelper::~AssertHelper(&local_298);
    testing::Message::~Message((Message *)0x1f9811);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1f9869);
  testing::internal::ConstCharPtr::ConstCharPtr(&local_2a0,"");
  uVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_2a0);
  if ((bool)uVar1) {
    local_2a1 = 0;
    uVar3 = testing::internal::AlwaysTrue();
    if ((bool)uVar3) {
      cfd::core::ByteData160::ByteData160(local_440);
      cfd::AddressFactory::GetAddressByHash
                ((AddressFactory *)CONCAT44(AVar4,uVar5),
                 (AddressType)((ulong)in_stack_fffffffffffffb70 >> 0x20),
                 (ByteData160 *)CONCAT17(uVar1,CONCAT16(uVar3,in_stack_fffffffffffffb68)));
      cfd::core::Address::~Address(in_stack_fffffffffffffb70);
      cfd::core::ByteData160::~ByteData160((ByteData160 *)0x1f98fd);
    }
    if ((local_2a1 & 1) != 0) goto LAB_001f9a64;
    local_2a0.value =
         "Expected: factory.GetAddressByHash(AddressType::kP2wpkhAddress, ByteData160()) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_458);
  testing::internal::AssertHelper::AssertHelper
            (&local_460,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
             ,0x9d,local_2a0.value);
  testing::internal::AssertHelper::operator=(&local_460,local_458);
  testing::internal::AssertHelper::~AssertHelper(&local_460);
  testing::Message::~Message((Message *)0x1f9a22);
LAB_001f9a64:
  cfd::core::Address::~Address(in_stack_fffffffffffffb70);
  cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x1f9a7e);
  return;
}

Assistant:

TEST(ElementsAddressFactory, GetAddressByHash160)
{
  {
    ElementsAddressFactory factory(NetType::kElementsRegtest, GetElementsAddressFormatList());
    Address address = factory.GetAddressByHash(AddressType::kP2pkhAddress, ByteData160("c4d571179a455b8976b79cf99183fd2bbafe6bfd"));
    EXPECT_STREQ(address.GetHash().GetHex().c_str(), "c4d571179a455b8976b79cf99183fd2bbafe6bfd");
    EXPECT_EQ(address.GetAddressType(), AddressType::kP2pkhAddress);

    EXPECT_THROW(factory.GetAddressByHash(AddressType::kP2wpkhAddress, ByteData160()), CfdException);
  }
}